

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall front::syntax::SyntaxAnalyze::SyntaxAnalyze(SyntaxAnalyze *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_initLayerNum = 0;
  this->matched_index = 0xffffffffffffffff;
  this->layer_num = 0;
  this->_genValueNum = 0;
  this->word_list = &tmp_vect_word;
  symbolTable::SymbolTable::SymbolTable(&this->symbolTable);
  irGenerator::irGenerator::irGenerator(&this->irGenerator);
  p_Var1 = &(this->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header;
  (this->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->bmirVariableTable).name2VarSingle._M_t._M_impl.super__Rb_tree_header;
  (this->bmirVariableTable).name2VarSingle._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->bmirVariableTable).name2VarSingle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bmirVariableTable).name2VarSingle._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bmirVariableTable).name2VarSingle._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bmirVariableTable).name2VarSingle._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

SyntaxAnalyze::SyntaxAnalyze() : matched_index(-1), word_list(tmp_vect_word) {}